

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
::delete_leaf_node(btree<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                   *this,node_type *node)

{
  byte bVar1;
  size_type n;
  
  btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  ::destroy(node,(allocator_type *)this);
  bVar1 = btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
          ::max_count(node);
  n = btree_node<phmap::priv::map_params<phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::CopyableMovableInstance>,_std::allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
      ::LeafSize((uint)bVar1);
  Deallocate<8ul,std::allocator<std::pair<phmap::test_internal::CopyableMovableInstance_const,phmap::test_internal::MovableOnlyInstance>>>
            ((allocator<std::pair<const_phmap::test_internal::CopyableMovableInstance,_phmap::test_internal::MovableOnlyInstance>_>
              *)this,node,n);
  return;
}

Assistant:

void delete_leaf_node(node_type *node) {
            node->destroy(mutable_allocator());
            deallocate(node_type::LeafSize(node->max_count()), node);
        }